

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void server_pull(int fd)

{
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  reference pvVar4;
  MsgType in_stack_00000008;
  string local_1c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [8];
  string file;
  int local_184;
  undefined1 local_180 [4];
  int j;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string local_148 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [8];
  string dir;
  int local_c4;
  string local_c0 [4];
  int i;
  string local_a0 [32];
  undefined1 local_80 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  server_hashes;
  string local_60 [8];
  string client_hash;
  string local_30 [36];
  int local_c;
  int fd_local;
  
  local_c = fd;
  std::__cxx11::string::string(local_30,(string *)HEAD_abi_cxx11_);
  fileToMsg((string *)local_30,(Msg *)&stack0x00000008);
  std::__cxx11::string::~string(local_30);
  in_stack_00000008 = MSG_PULL;
  send(local_c,(Msg *)&stack0x00000008,0x7d4,0);
  recv(local_c,(Msg *)&stack0x00000008,0x7d4,0x100);
  if (in_stack_00000008 != MSG_END) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_60,&stack0x000003f4,
               (allocator *)
               ((long)&server_hashes.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&server_hashes.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar2 = (char *)std::__cxx11::string::c_str();
    read_all_lines_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_80,pcVar2);
    std::__cxx11::string::string(local_a0,(string *)HEAD_abi_cxx11_);
    fileToMsg((string *)local_a0,(Msg *)&stack0x00000008);
    std::__cxx11::string::~string(local_a0);
    in_stack_00000008 = MSG_PULL;
    send(local_c,(Msg *)&stack0x00000008,0x7d4,0);
    std::__cxx11::string::string(local_c0,(string *)LOG_abi_cxx11_);
    fileToMsg((string *)local_c0,(Msg *)&stack0x00000008);
    std::__cxx11::string::~string(local_c0);
    send(local_c,(Msg *)&stack0x00000008,0x7d4,0);
    local_c4 = 0;
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_60,"");
    if (bVar1) {
      while( true ) {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_80,(long)local_c4);
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_60,pvVar4);
        if (!bVar1) break;
        local_c4 = local_c4 + 1;
      }
      local_c4 = local_c4 + 1;
    }
    while (sVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_80), (ulong)(long)local_c4 < sVar3) {
      std::operator+(local_128,COMMITS_DIR_abi_cxx11_);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_80,(long)local_c4);
      std::__cxx11::string::string
                ((string *)
                 &files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pvVar4);
      deleteEndl(local_148);
      std::operator+(local_108,local_128);
      std::operator+(local_e8,(char *)local_108);
      std::__cxx11::string::~string((string *)local_108);
      std::__cxx11::string::~string((string *)local_148);
      std::__cxx11::string::~string
                ((string *)
                 &files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)local_128);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      ls_abi_cxx11_((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_180,pcVar2);
      for (local_184 = 0;
          sVar3 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_180), (ulong)(long)local_184 < sVar3; local_184 = local_184 + 1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_180,(long)local_184);
        std::operator+(local_1a8,local_e8);
        std::__cxx11::string::string(local_1c8,(string *)local_1a8);
        fileToMsg((string *)local_1c8,(Msg *)&stack0x00000008);
        std::__cxx11::string::~string(local_1c8);
        in_stack_00000008 = MSG_PULL;
        send(local_c,(Msg *)&stack0x00000008,0x7d4,0);
        std::__cxx11::string::~string((string *)local_1a8);
      }
      local_c4 = local_c4 + 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_180);
      std::__cxx11::string::~string((string *)local_e8);
    }
    in_stack_00000008 = MSG_END;
    send(local_c,(Msg *)&stack0x00000008,0x7d4,0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_80);
    std::__cxx11::string::~string(local_60);
  }
  return;
}

Assistant:

void server_pull(int fd, Msg msg) {
    fileToMsg(HEAD,msg);
    msg.type = MSG_PULL;
    send(fd,&msg,sizeof(msg),0);
    recv(fd, &msg, sizeof(msg), MSG_WAITALL);
    if(msg.type == MSG_END) return;
    String client_hash = msg.buf2;
    Vector<String> server_hashes = read_all_lines(HEAD.c_str());
    fileToMsg(HEAD,msg);
    msg.type = MSG_PULL;
    send(fd,&msg,sizeof(msg),0);
    fileToMsg(LOG,msg);
    send(fd,&msg,sizeof(msg),0);
    int i = 0;
    if(client_hash != ""){
        while(client_hash != server_hashes[i]){
            i++;
        }
        i++;
    }
    while(i<server_hashes.size()){
        String dir = COMMITS_DIR + "/" + deleteEndl(server_hashes[i]) + "/";
        Vector<String> files = ls(dir.c_str());
        for(int j = 0; j < files.size();j++){
            String file = dir + files[j];
            fileToMsg(file,msg);
            msg.type = MSG_PULL;
            send(fd,&msg,sizeof(msg),0);
        }
        i++;
    }
    msg.type = MSG_END;
    send(fd,&msg,sizeof(msg),0);
}